

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O3

void CombinationKeygenRecurse<Blob<224>,block16>
               (block16 *key,int len,int maxlen,block16 *blocks,int blockcount,pfHash hash,
               vector<Blob<224>,_std::allocator<Blob<224>_>_> *hashes)

{
  undefined8 uVar1;
  long lVar2;
  Blob<224> h;
  undefined1 local_58 [12];
  uint8_t auStack_4c [4];
  undefined1 auStack_48 [12];
  
  if (0 < blockcount && len != maxlen) {
    lVar2 = 0;
    do {
      uVar1 = *(undefined8 *)(blocks->c + lVar2 + 8);
      *(undefined8 *)key[len].c = *(undefined8 *)(blocks->c + lVar2);
      *(undefined8 *)(key[len].c + 8) = uVar1;
      auStack_48 = SUB1612(ZEXT816(0),0);
      local_58 = auStack_48 << 0x20;
      auStack_4c[0] = '\0';
      auStack_4c[1] = '\0';
      auStack_4c[2] = '\0';
      auStack_4c[3] = '\0';
      (*hash)(key,(len + 1) * 0x10,0,(value_type *)local_58);
      std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::push_back(hashes,(value_type *)local_58);
      CombinationKeygenRecurse<Blob<224>,block16>(key,len + 1,maxlen,blocks,blockcount,hash,hashes);
      lVar2 = lVar2 + 0x10;
    } while ((ulong)(uint)blockcount << 4 != lVar2);
  }
  return;
}

Assistant:

void CombinationKeygenRecurse ( blocktype * key, int len, int maxlen,
                  blocktype * blocks, int blockcount,
                  pfHash hash, std::vector<hashtype> & hashes )
{
  if(len == maxlen) return;  // end recursion

  for(int i = 0; i < blockcount; i++)
  {
    key[len] = blocks[i];

    //if(len == maxlen-1)
    {
      hashtype h;
      hash(key, (len+1) * sizeof(blocktype), 0, &h);
      hashes.push_back(h);
    }

    //else
    {
      CombinationKeygenRecurse(key,len+1,maxlen,blocks,blockcount,hash,hashes);
    }
  }
}